

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O0

EStatusCode __thiscall
ShadingWriter::WriteRGBATiledPatternObject
          (ShadingWriter *this,RadialShading *inRadialShading,PDFRectangle *inBounds,
          PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  InterpretedGradientStopList local_b0;
  undefined1 local_98 [8];
  RadialShading alphaRadialShading;
  ObjectIDType rgbShadingPatternObjectId;
  ObjectIDType alphaShadingPatternObjectId;
  ObjectIDType OStack_30;
  EStatusCode status;
  ObjectIDType inPatternObjectId_local;
  PDFMatrix *inMatrix_local;
  PDFRectangle *inBounds_local;
  RadialShading *inRadialShading_local;
  ShadingWriter *this_local;
  
  alphaShadingPatternObjectId._4_4_ = 0;
  OStack_30 = inPatternObjectId;
  inPatternObjectId_local = (ObjectIDType)inMatrix;
  inMatrix_local = (PDFMatrix *)inBounds;
  inBounds_local = (PDFRectangle *)inRadialShading;
  inRadialShading_local = (RadialShading *)this;
  alphaShadingPatternObjectId._4_4_ =
       WriteSoftmaskPatternObjectForRGBAShades
                 (this,inBounds,inMatrix,inPatternObjectId,&rgbShadingPatternObjectId,
                  (ObjectIDType *)&alphaRadialShading.gradientExtend);
  if (alphaShadingPatternObjectId._4_4_ == eSuccess) {
    RadialShading::RadialShading((RadialShading *)local_98,(RadialShading *)inBounds_local);
    CreateAlphaShadingColorLine
              (&local_b0,this,(InterpretedGradientStopList *)&inBounds_local[1].UpperRightX);
    std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::operator=
              ((list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_> *)
               &alphaRadialShading.r1,&local_b0);
    std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::~list
              (&local_b0);
    alphaShadingPatternObjectId._4_4_ =
         WriteRGBShadingPatternObject
                   (this,(RadialShading *)local_98,(PDFRectangle *)inMatrix_local,
                    (PDFMatrix *)inPatternObjectId_local,rgbShadingPatternObjectId);
    if (alphaShadingPatternObjectId._4_4_ == eSuccess) {
      alphaShadingPatternObjectId._4_4_ =
           WriteRGBShadingPatternObject
                     (this,(RadialShading *)inBounds_local,(PDFRectangle *)inMatrix_local,
                      (PDFMatrix *)inPatternObjectId_local,alphaRadialShading._72_8_);
    }
    RadialShading::~RadialShading((RadialShading *)local_98);
  }
  return alphaShadingPatternObjectId._4_4_;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteRGBATiledPatternObject(
    const RadialShading& inRadialShading, 
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId
) {
    EStatusCode status = eSuccess;
    ObjectIDType alphaShadingPatternObjectId;
    ObjectIDType rgbShadingPatternObjectId;

    do {
        status = WriteSoftmaskPatternObjectForRGBAShades(inBounds, inMatrix, inPatternObjectId, alphaShadingPatternObjectId, rgbShadingPatternObjectId);
        if(status != eSuccess)
            break;

        // now, draw the alpha shading, which has the same pysical properties of the rgb one, but colors are all the alpha
        // component transitioning as a gradient
        RadialShading alphaRadialShading = inRadialShading;
        alphaRadialShading.colorLine = CreateAlphaShadingColorLine(inRadialShading.colorLine);

        status = WriteRGBShadingPatternObject(alphaRadialShading, inBounds, inMatrix, alphaShadingPatternObjectId);
        if(status != eSuccess)
            break;

        status = WriteRGBShadingPatternObject(inRadialShading, inBounds, inMatrix, rgbShadingPatternObjectId);

    } while(false);


    return status;    

}